

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_fma::forward(Cast_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint _c;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  unsigned_short uVar9;
  _func_int **pp_Var10;
  int iVar11;
  void *pvVar12;
  _func_int *p_Var13;
  size_t sVar14;
  undefined1 (*pauVar15) [32];
  int iVar16;
  void *pvVar17;
  undefined1 (*pauVar18) [16];
  int i;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  float fVar28;
  
  p_Var13 = this->_vptr_Cast_x86_fma[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var13) == *(int *)(&this->field_0xd4 + (long)p_Var13)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar11 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar11;
    top_blob->h = iVar24;
    top_blob->d = iVar2;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar11 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar16 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar14 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var13)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var13) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_fma + (long)p_Var13),bottom_blob,top_blob,
                    opt);
    }
    sVar14 = sVar14 * 4;
    break;
  case 2:
  case 4:
    sVar14 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar14 = bottom_blob->elemsize;
  }
  switch(iVar16) {
  case 1:
    Mat::create(top_blob,iVar11,sVar14,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar11,iVar24,sVar14,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar11,iVar24,_c,sVar14,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar11,iVar24,iVar2,_c,sVar14,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var10 = this->_vptr_Cast_x86_fma;
  p_Var13 = pp_Var10[-3];
  iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  if (iVar16 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var13) == 2) {
      iVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar26 = 0;
      uVar21 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar21 = uVar26;
      }
      for (; uVar26 != uVar21; uVar26 = uVar26 + 1) {
        pvVar12 = bottom_blob->data;
        sVar14 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar15 = (undefined1 (*) [32])(sVar4 * uVar26 * sVar14 + (long)pvVar12);
        pvVar17 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar18 = (undefined1 (*) [16])(sVar6 * uVar26 * sVar5 + (long)pvVar17);
        lVar25 = 0;
        for (iVar19 = 0; iVar19 + 7 < iVar16; iVar19 = iVar19 + 8) {
          auVar1 = vcvtps2ph_f16c(*pauVar15,3);
          *pauVar18 = auVar1;
          pauVar15 = pauVar15 + 1;
          pauVar18 = pauVar18 + 1;
          lVar25 = lVar25 + 8;
        }
        for (; iVar19 + 3 < iVar16; iVar19 = iVar19 + 4) {
          vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar15,3);
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          lVar25 = lVar25 + 4;
        }
        for (; (int)lVar25 < iVar16; lVar25 = lVar25 + 1) {
          uVar9 = float32_to_float16(*(float *)((long)pvVar12 + lVar25 * 4 + sVar4 * sVar14 * uVar26
                                               ));
          *(unsigned_short *)((long)pvVar17 + lVar25 * 2 + sVar6 * sVar5 * uVar26) = uVar9;
        }
      }
      pp_Var10 = this->_vptr_Cast_x86_fma;
      p_Var13 = pp_Var10[-3];
      iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var13);
      goto LAB_00490362;
    }
    iVar16 = 1;
LAB_004904f0:
    pp_Var10 = pp_Var10 + -3;
  }
  else {
LAB_00490362:
    if (iVar16 == 2) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var13) != 1) {
        iVar16 = 2;
        goto LAB_004904f0;
      }
      iVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar26 = 0;
      uVar21 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar21 = uVar26;
      }
      for (; uVar26 != uVar21; uVar26 = uVar26 + 1) {
        pvVar12 = bottom_blob->data;
        sVar14 = bottom_blob->elemsize;
        sVar4 = bottom_blob->cstep;
        pauVar18 = (undefined1 (*) [16])(sVar4 * uVar26 * sVar14 + (long)pvVar12);
        pvVar17 = top_blob->data;
        sVar5 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pauVar15 = (undefined1 (*) [32])(sVar6 * uVar26 * sVar5 + (long)pvVar17);
        lVar25 = 0;
        for (iVar19 = 0; iVar19 + 7 < iVar16; iVar19 = iVar19 + 8) {
          auVar8 = vcvtph2ps_f16c(*pauVar18);
          *pauVar15 = auVar8;
          pauVar18 = pauVar18 + 1;
          pauVar15 = pauVar15 + 1;
          lVar25 = lVar25 + 8;
        }
        for (; iVar19 + 3 < iVar16; iVar19 = iVar19 + 4) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)*pauVar18;
          auVar1 = vcvtph2ps_f16c(auVar1);
          *(undefined1 (*) [16])*pauVar15 = auVar1;
          pauVar18 = (undefined1 (*) [16])(*pauVar18 + 8);
          pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
          lVar25 = lVar25 + 4;
        }
        for (; (int)lVar25 < iVar16; lVar25 = lVar25 + 1) {
          fVar28 = float16_to_float32(*(unsigned_short *)
                                       ((long)pvVar12 + lVar25 * 2 + sVar4 * sVar14 * uVar26));
          *(float *)((long)pvVar17 + lVar25 * 4 + sVar6 * sVar5 * uVar26) = fVar28;
        }
      }
      pp_Var10 = this->_vptr_Cast_x86_fma;
      p_Var13 = pp_Var10[-3];
      iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var13);
    }
    pp_Var10 = pp_Var10 + -3;
    if (iVar16 == 3) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var13) != 1) {
        return 0;
      }
      uVar23 = iVar2 * _elempack * iVar24 * iVar11;
      pvVar12 = bottom_blob->data;
      sVar14 = bottom_blob->cstep;
      pvVar17 = top_blob->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      uVar26 = 0;
      uVar21 = (ulong)uVar23;
      if ((int)uVar23 < 1) {
        uVar21 = uVar26;
      }
      uVar22 = (ulong)_c;
      if ((int)_c < 1) {
        uVar22 = uVar26;
      }
      sVar6 = bottom_blob->elemsize;
      for (; uVar26 != uVar22; uVar26 = uVar26 + 1) {
        for (uVar20 = 0; uVar21 != uVar20; uVar20 = uVar20 + 1) {
          *(float *)((long)pvVar17 + uVar20 * 4) = (float)(int)*(char *)((long)pvVar12 + uVar20);
        }
        pvVar17 = (void *)((long)pvVar17 + sVar4 * sVar5);
        pvVar12 = (void *)((long)pvVar12 + sVar14 * sVar6);
      }
      p_Var13 = *pp_Var10;
      iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var13);
    }
  }
  if (iVar16 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var13) != 4) {
      return 0;
    }
    iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    pvVar12 = bottom_blob->data;
    sVar14 = bottom_blob->elemsize;
    pvVar17 = top_blob->data;
    sVar4 = top_blob->elemsize;
    sVar5 = top_blob->cstep;
    uVar21 = 0;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    uVar26 = (ulong)(uint)bottom_blob->c;
    if (bottom_blob->c < 1) {
      uVar26 = uVar21;
    }
    sVar6 = bottom_blob->cstep;
    for (; uVar21 != uVar26; uVar21 = uVar21 + 1) {
      for (lVar25 = 0; iVar11 != (int)lVar25; lVar25 = lVar25 + 1) {
        *(undefined2 *)((long)pvVar17 + lVar25 * 2) =
             *(undefined2 *)((long)pvVar12 + lVar25 * 4 + 2);
      }
      pvVar12 = (void *)((long)pvVar12 + sVar14 * sVar6);
      pvVar17 = (void *)((long)pvVar17 + sVar4 * sVar5);
    }
    p_Var13 = *pp_Var10;
    iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  }
  if ((iVar16 == 4) && (*(int *)(&this->field_0xd4 + (long)p_Var13) == 1)) {
    iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    uVar21 = (ulong)(uint)bottom_blob->c;
    if (bottom_blob->c < 1) {
      uVar21 = 0;
    }
    for (uVar26 = 0; uVar26 != uVar21; uVar26 = uVar26 + 1) {
      pvVar12 = bottom_blob->data;
      sVar14 = bottom_blob->elemsize;
      sVar4 = bottom_blob->cstep;
      pauVar18 = (undefined1 (*) [16])(sVar4 * uVar26 * sVar14 + (long)pvVar12);
      pvVar17 = top_blob->data;
      sVar5 = top_blob->elemsize;
      sVar6 = top_blob->cstep;
      pauVar27 = (undefined1 (*) [16])(sVar6 * uVar26 * sVar5 + (long)pvVar17);
      lVar25 = 0;
      for (iVar24 = 0; iVar24 + 7 < iVar11; iVar24 = iVar24 + 8) {
        auVar1 = vlddqu_avx(*pauVar18);
        auVar7 = vpunpcklwd_avx((undefined1  [16])0x0,auVar1);
        auVar1 = vpunpckhwd_avx((undefined1  [16])0x0,auVar1);
        pauVar27[1] = auVar1;
        *pauVar27 = auVar7;
        pauVar18 = pauVar18 + 1;
        pauVar27 = pauVar27 + 2;
        lVar25 = lVar25 + 8;
      }
      for (; (int)lVar25 < iVar11; lVar25 = lVar25 + 1) {
        *(uint *)((long)pvVar17 + lVar25 * 4 + sVar6 * sVar5 * uVar26) =
             (uint)*(ushort *)((long)pvVar12 + lVar25 * 2 + sVar4 * sVar14 * uVar26) << 0x10;
      }
    }
  }
  return 0;
}

Assistant:

int Cast_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}